

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::setRootType
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr type)

{
  SourceFile *pSVar1;
  StructSchema SVar2;
  StringPtr name;
  Fault f;
  undefined1 local_58 [48];
  undefined1 local_28 [16];
  
  pSVar1 = (this->sourceFiles).builder.ptr;
  if ((long)(this->sourceFiles).builder.pos - (long)pSVar1 != 0x20) {
    local_28._0_8_ = (_func_int **)0x0;
    local_58._0_8_ = (_func_int **)0x0;
    local_58._8_8_ = (CapTableReader *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)local_28,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)local_28);
  }
  name.content.size_ = (size_t)type.content.ptr;
  name.content.ptr = (char *)pSVar1->id;
  resolveName((CompilerMain *)local_58,(uint64_t)this,name);
  local_28[0] = local_58[0];
  if (local_58[0] == '\x01') {
    local_28._8_8_ = local_58._8_8_;
    Schema::getProto((Reader *)local_58,(Schema *)(local_28 + 8));
    if ((0x6f < (uint)local_58._32_4_) &&
       (*(short *)((long)&((ArrayDisposer *)(local_58._16_8_ + 8))->_vptr_ArrayDisposer + 4) == 1))
    {
      SVar2 = Schema::asStruct((Schema *)(local_28 + 8));
      (this->rootType).super_Schema.raw = (RawBrandedSchema *)SVar2.super_Schema.raw;
      (__return_storage_ptr__->errorMessage).ptr.isSet = false;
      return __return_storage_ptr__;
    }
    kj::heapString((String *)local_58,"not a struct type",0x11);
  }
  else {
    kj::heapString((String *)local_58,"no such type",0xc);
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = true;
  *(undefined8 *)&(__return_storage_ptr__->errorMessage).ptr.field_1 = local_58._0_8_;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = local_58._8_8_;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
       (ArrayDisposer *)local_58._16_8_;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setRootType(kj::StringPtr type) {
    KJ_ASSERT(sourceFiles.size() == 1);

    KJ_IF_MAYBE(schema, resolveName(sourceFiles[0].id, type)) {
      if (schema->getProto().which() != schema::Node::STRUCT) {
        return "not a struct type";
      }
      rootType = schema->asStruct();
      return true;
    } else {
      return "no such type";
    }
  }